

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::EndMenuBar(void)

{
  float fVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  ImGuiWindow *pIVar5;
  ImGuiGroupData *pIVar6;
  undefined1 auVar8 [56];
  undefined1 auVar7 [64];
  undefined8 in_XMM1_Qb;
  ImRect IVar9;
  ImGuiNavLayer layer;
  ImGuiWindow *nav_earliest_child;
  ImGuiContext *g;
  ImGuiWindow *window;
  uint in_stack_ffffffffffffffd0;
  uint uVar10;
  undefined4 in_stack_ffffffffffffffd4;
  ImGuiID in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe0;
  ImGuiID in_stack_ffffffffffffffe4;
  ImGuiWindow *local_18;
  ImGuiContext *window_00;
  
  pIVar5 = GetCurrentWindow();
  if ((pIVar5->SkipItems & 1U) == 0) {
    window_00 = GImGui;
    bVar4 = NavMoveRequestButNoResultYet();
    if ((bVar4) &&
       (((window_00->NavMoveDir == 0 || (window_00->NavMoveDir == 1)) &&
        ((window_00->NavWindow->Flags & 0x10000000U) != 0)))) {
      local_18 = window_00->NavWindow;
      uVar10 = in_stack_ffffffffffffffd0;
      while( true ) {
        in_stack_ffffffffffffffd0 = uVar10 & 0xffffff;
        if (local_18->ParentWindow != (ImGuiWindow *)0x0) {
          in_stack_ffffffffffffffd0 =
               CONCAT13((local_18->ParentWindow->Flags & 0x10000000U) != 0,(int3)uVar10);
        }
        if ((char)(in_stack_ffffffffffffffd0 >> 0x18) == '\0') break;
        local_18 = local_18->ParentWindow;
        uVar10 = in_stack_ffffffffffffffd0;
      }
      if (((local_18->ParentWindow == pIVar5) && ((local_18->DC).ParentLayoutType == 0)) &&
         (window_00->NavMoveRequestForward == ImGuiNavForward_None)) {
        in_stack_ffffffffffffffe4 = 1;
        if (((pIVar5->DC).NavLayerActiveMaskNext & 2U) == 0) {
          __assert_fail("window->DC.NavLayerActiveMaskNext & (1 << layer)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_widgets.cpp"
                        ,0x199e,"void ImGui::EndMenuBar()");
        }
        FocusWindow((ImGuiWindow *)window_00);
        SetNavIDWithRectRel(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0,
                            in_stack_ffffffffffffffdc,
                            (ImRect *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0))
        ;
        window_00->NavLayer = ImGuiNavLayer_Menu;
        window_00->NavDisableHighlight = true;
        window_00->NavMoveRequestForward = ImGuiNavForward_ForwardQueued;
        NavMoveRequestCancel();
      }
    }
    if ((pIVar5->Flags & 0x400U) == 0) {
      __assert_fail("window->Flags & ImGuiWindowFlags_MenuBar",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_widgets.cpp"
                    ,0x19a8,"void ImGui::EndMenuBar()");
    }
    if (((pIVar5->DC).MenuBarAppending & 1U) == 0) {
      __assert_fail("window->DC.MenuBarAppending",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_widgets.cpp"
                    ,0x19a9,"void ImGui::EndMenuBar()");
    }
    PopClipRect();
    PopID();
    fVar1 = (pIVar5->DC).CursorPos.x;
    auVar8 = (undefined1  [56])0x0;
    IVar9 = ImGuiWindow::MenuBarRect
                      ((ImGuiWindow *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0))
    ;
    auVar7._0_8_ = IVar9.Min;
    auVar7._8_56_ = auVar8;
    uVar2 = vmovlpd_avx(auVar7._0_16_);
    auVar3._8_8_ = in_XMM1_Qb;
    auVar3._0_4_ = IVar9.Max.x;
    auVar3._4_4_ = IVar9.Max.y;
    vmovlpd_avx(auVar3);
    (pIVar5->DC).MenuBarOffset.x = fVar1 - (float)uVar2;
    pIVar6 = ImVector<ImGuiGroupData>::back
                       ((ImVector<ImGuiGroupData> *)CONCAT44((float)uVar2,in_stack_ffffffffffffffd0)
                       );
    pIVar6->EmitItem = false;
    EndGroup();
    (pIVar5->DC).LayoutType = 1;
    (pIVar5->DC).NavLayerCurrent = ImGuiNavLayer_Main;
    (pIVar5->DC).MenuBarAppending = false;
  }
  return;
}

Assistant:

void ImGui::EndMenuBar()
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;
    ImGuiContext& g = *GImGui;

    // Nav: When a move request within one of our child menu failed, capture the request to navigate among our siblings.
    if (NavMoveRequestButNoResultYet() && (g.NavMoveDir == ImGuiDir_Left || g.NavMoveDir == ImGuiDir_Right) && (g.NavWindow->Flags & ImGuiWindowFlags_ChildMenu))
    {
        ImGuiWindow* nav_earliest_child = g.NavWindow;
        while (nav_earliest_child->ParentWindow && (nav_earliest_child->ParentWindow->Flags & ImGuiWindowFlags_ChildMenu))
            nav_earliest_child = nav_earliest_child->ParentWindow;
        if (nav_earliest_child->ParentWindow == window && nav_earliest_child->DC.ParentLayoutType == ImGuiLayoutType_Horizontal && g.NavMoveRequestForward == ImGuiNavForward_None)
        {
            // To do so we claim focus back, restore NavId and then process the movement request for yet another frame.
            // This involve a one-frame delay which isn't very problematic in this situation. We could remove it by scoring in advance for multiple window (probably not worth the hassle/cost)
            const ImGuiNavLayer layer = ImGuiNavLayer_Menu;
            IM_ASSERT(window->DC.NavLayerActiveMaskNext & (1 << layer)); // Sanity check
            FocusWindow(window);
            SetNavIDWithRectRel(window->NavLastIds[layer], layer, 0, window->NavRectRel[layer]);
            g.NavLayer = layer;
            g.NavDisableHighlight = true; // Hide highlight for the current frame so we don't see the intermediary selection.
            g.NavMoveRequestForward = ImGuiNavForward_ForwardQueued;
            NavMoveRequestCancel();
        }
    }

    IM_ASSERT(window->Flags & ImGuiWindowFlags_MenuBar);
    IM_ASSERT(window->DC.MenuBarAppending);
    PopClipRect();
    PopID();
    window->DC.MenuBarOffset.x = window->DC.CursorPos.x - window->MenuBarRect().Min.x; // Save horizontal position so next append can reuse it. This is kinda equivalent to a per-layer CursorPos.
    g.GroupStack.back().EmitItem = false;
    EndGroup(); // Restore position on layer 0
    window->DC.LayoutType = ImGuiLayoutType_Vertical;
    window->DC.NavLayerCurrent = ImGuiNavLayer_Main;
    window->DC.MenuBarAppending = false;
}